

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_vpz_ool(DisasContext_conflict1 *s,arg_rpr_esz *a,gen_helper_gvec_reduc *fn)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  uint32_t uVar2;
  TCGv_i32 pTVar3;
  TCGv_i64 v;
  TCGv_ptr ret;
  TCGv_ptr ret_00;
  uintptr_t o;
  uintptr_t o_1;
  uintptr_t o_2;
  uintptr_t o_3;
  
  if (fn != (gen_helper_gvec_reduc *)0x0) {
    tcg_ctx = s->uc->tcg_ctx;
    uVar2 = s->sve_len;
    _Var1 = sve_access_check_aarch64(s);
    if (_Var1) {
      uVar2 = simd_desc_aarch64(uVar2,uVar2,0);
      pTVar3 = tcg_const_i32_aarch64(tcg_ctx,uVar2);
      v = tcg_temp_new_i64(tcg_ctx);
      ret = tcg_temp_new_ptr(tcg_ctx);
      ret_00 = tcg_temp_new_ptr(tcg_ctx);
      tcg_gen_addi_i64_aarch64
                (tcg_ctx,(TCGv_i64)ret,(TCGv_i64)tcg_ctx->cpu_env,(long)(a->rn * 0x100 + 0xc10));
      tcg_gen_addi_i64_aarch64
                (tcg_ctx,(TCGv_i64)ret_00,(TCGv_i64)tcg_ctx->cpu_env,(long)(a->pg * 0x20 + 0x2c10));
      (*fn)(tcg_ctx,v,ret,ret_00,pTVar3);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      write_fp_dreg_aarch64(s,a->rd,v);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(v + (long)tcg_ctx));
    }
  }
  return fn != (gen_helper_gvec_reduc *)0x0;
}

Assistant:

static bool do_vpz_ool(DisasContext *s, arg_rpr_esz *a,
                       gen_helper_gvec_reduc *fn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    TCGv_ptr t_zn, t_pg;
    TCGv_i32 desc;
    TCGv_i64 temp;

    if (fn == NULL) {
        return false;
    }
    if (!sve_access_check(s)) {
        return true;
    }

    desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, vsz, 0));
    temp = tcg_temp_new_i64(tcg_ctx);
    t_zn = tcg_temp_new_ptr(tcg_ctx);
    t_pg = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_zn, tcg_ctx->cpu_env, vec_full_reg_offset(s, a->rn));
    tcg_gen_addi_ptr(tcg_ctx, t_pg, tcg_ctx->cpu_env, pred_full_reg_offset(s, a->pg));
    fn(tcg_ctx, temp, t_zn, t_pg, desc);
    tcg_temp_free_ptr(tcg_ctx, t_zn);
    tcg_temp_free_ptr(tcg_ctx, t_pg);
    tcg_temp_free_i32(tcg_ctx, desc);

    write_fp_dreg(s, a->rd, temp);
    tcg_temp_free_i64(tcg_ctx, temp);
    return true;
}